

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laplace_pyramid.h
# Opt level: O0

void gimage::collapseLaplacianPyramid<unsigned_short>
               (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image,
               vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
               *p)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  long lVar4;
  long lVar5;
  long *plVar6;
  vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
  *in_RSI;
  float fVar7;
  long i_2;
  long k_2;
  long i_1;
  long k_1;
  long i;
  long k;
  float *px;
  long in_stack_00000058;
  int d;
  long h;
  long w;
  int l;
  long local_78;
  long local_70 [3];
  Image<float,_gimage::PixelTraits<float>_> *in_stack_ffffffffffffffa8;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_stack_ffffffffffffffb0;
  long in_stack_ffffffffffffffb8;
  Image<float,_gimage::PixelTraits<float>_> *image_00;
  float *local_38;
  int local_2c;
  int local_14;
  
  sVar2 = std::
          vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
          ::size(in_RSI);
  if (sVar2 != 0) {
    sVar2 = std::
            vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
            ::size(in_RSI);
    if (1 < sVar2) {
      sVar2 = std::
              vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
              ::size(in_RSI);
      for (local_14 = (int)sVar2 + -2; -1 < local_14; local_14 = local_14 + -1) {
        pvVar3 = std::
                 vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                 ::operator[](in_RSI,(long)local_14);
        lVar4 = Image<float,_gimage::PixelTraits<float>_>::getWidth(pvVar3);
        pvVar3 = std::
                 vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                 ::operator[](in_RSI,(long)local_14);
        lVar5 = Image<float,_gimage::PixelTraits<float>_>::getHeight(pvVar3);
        local_2c = 0;
        while( true ) {
          pvVar3 = std::
                   vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                   ::operator[](in_RSI,(long)local_14);
          iVar1 = Image<float,_gimage::PixelTraits<float>_>::getDepth(pvVar3);
          if (iVar1 <= local_2c) break;
          pvVar3 = std::
                   vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                   ::operator[](in_RSI,(long)local_14);
          local_38 = Image<float,_gimage::PixelTraits<float>_>::getPtr(pvVar3,0,0,local_2c);
          for (image_00 = (Image<float,_gimage::PixelTraits<float>_> *)0x0;
              (long)image_00 < 2 && (long)image_00 < lVar5;
              image_00 = (Image<float,_gimage::PixelTraits<float>_> *)((long)&image_00->depth + 1))
          {
            for (in_stack_ffffffffffffffb8 = 0; in_stack_ffffffffffffffb8 < lVar4;
                in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 + 1) {
              std::
              vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
              ::operator[](in_RSI,(long)(local_14 + 1));
              fVar7 = expandGaussPixel<float>
                                ((Image<float,_gimage::PixelTraits<float>_> *)h,in_stack_00000058,
                                 (long)px,k._4_4_);
              *local_38 = fVar7 + *local_38;
              local_38 = local_38 + 1;
            }
          }
          for (in_stack_ffffffffffffffb0 =
                    (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)0x2;
              (long)in_stack_ffffffffffffffb0 < lVar5 + -2;
              in_stack_ffffffffffffffb0 =
                   (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)
                   ((long)&in_stack_ffffffffffffffb0->depth + 1)) {
            if (0 < lVar4) {
              std::
              vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
              ::operator[](in_RSI,(long)(local_14 + 1));
              fVar7 = expandGaussPixel<float>
                                ((Image<float,_gimage::PixelTraits<float>_> *)h,in_stack_00000058,
                                 (long)px,k._4_4_);
              *local_38 = fVar7 + *local_38;
              local_38 = local_38 + 1;
            }
            if (1 < lVar4) {
              std::
              vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
              ::operator[](in_RSI,(long)(local_14 + 1));
              fVar7 = expandGaussPixel<float>
                                ((Image<float,_gimage::PixelTraits<float>_> *)h,in_stack_00000058,
                                 (long)px,k._4_4_);
              *local_38 = fVar7 + *local_38;
              local_38 = local_38 + 1;
            }
            for (in_stack_ffffffffffffffa8 = (Image<float,_gimage::PixelTraits<float>_> *)0x2;
                (long)in_stack_ffffffffffffffa8 < lVar4 + -2;
                in_stack_ffffffffffffffa8 =
                     (Image<float,_gimage::PixelTraits<float>_> *)
                     ((long)&in_stack_ffffffffffffffa8->depth + 1)) {
              std::
              vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
              ::operator[](in_RSI,(long)(local_14 + 1));
              fVar7 = expandGaussPixelInner<float>
                                (image_00,in_stack_ffffffffffffffb8,(long)in_stack_ffffffffffffffb0,
                                 (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
              *local_38 = fVar7 + *local_38;
              local_38 = local_38 + 1;
            }
            if (2 < lVar4) {
              std::
              vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
              ::operator[](in_RSI,(long)(local_14 + 1));
              fVar7 = expandGaussPixel<float>
                                ((Image<float,_gimage::PixelTraits<float>_> *)h,in_stack_00000058,
                                 (long)px,k._4_4_);
              *local_38 = fVar7 + *local_38;
              local_38 = local_38 + 1;
            }
            if (3 < lVar4) {
              std::
              vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
              ::operator[](in_RSI,(long)(local_14 + 1));
              fVar7 = expandGaussPixel<float>
                                ((Image<float,_gimage::PixelTraits<float>_> *)h,in_stack_00000058,
                                 (long)px,k._4_4_);
              *local_38 = fVar7 + *local_38;
              local_38 = local_38 + 1;
            }
          }
          local_70[1] = 0;
          local_70[0] = lVar5 + -2;
          plVar6 = std::max<long>(local_70 + 1,local_70);
          for (local_70[2] = *plVar6; local_70[2] < lVar5; local_70[2] = local_70[2] + 1) {
            for (local_78 = 0; local_78 < lVar4; local_78 = local_78 + 1) {
              std::
              vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
              ::operator[](in_RSI,(long)(local_14 + 1));
              fVar7 = expandGaussPixel<float>
                                ((Image<float,_gimage::PixelTraits<float>_> *)h,in_stack_00000058,
                                 (long)px,k._4_4_);
              *local_38 = fVar7 + *local_38;
              local_38 = local_38 + 1;
            }
          }
          local_2c = local_2c + 1;
        }
      }
    }
    std::
    vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
    ::operator[](in_RSI,0);
    Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setImageLimited<float>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  return;
}

Assistant:

void collapseLaplacianPyramid(Image<T> &image, std::vector<ImageFloat> &p)
{
  if (p.size() < 1) return; // there is no pyramid

  if (p.size() >= 2) // there must be at least two levels for collapsing
  {
    // collapse from highest to lowest level

    for (int l=static_cast<int>(p.size())-2; l>=0; l--)
    {
      // add expanded image of lower level

      const long w=p[l].getWidth();
      const long h=p[l].getHeight();

      // for all color channels

      for (int d=0; d<p[l].getDepth(); d++)
      {
        float *px=p[l].getPtr(0, 0, d);
        for (long k=0; k<2 && k<h; k++)
        {
          for (long i=0; i<w; i++)
          {
            *px++ +=expandGaussPixel(p[l+1], i, k, d);
          }
        }

        for (long k=2; k<h-2; k++)
        {
          if (w > 0) *px++ +=expandGaussPixel(p[l+1], 0, k, d);
          if (w > 1) *px++ +=expandGaussPixel(p[l+1], 1, k, d);

          for (long i=2; i<w-2; i++)
          {
            *px++ +=expandGaussPixelInner(p[l+1], i, k, d);
          }

          if (w > 2) *px++ +=expandGaussPixel(p[l+1], w-2, k, d);
          if (w > 3) *px++ +=expandGaussPixel(p[l+1], w-1, k, d);
        }

        for (long k=std::max(0l, h-2); k<h; k++)
        {
          for (long i=0; i<w; i++)
          {
            *px++ +=expandGaussPixel(p[l+1], i, k, d);
          }
        }
      }
    }
  }

  // image at level 0 is result

  image.setImageLimited(p[0]);
}